

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress2.c
# Opt level: O0

void Abc_NtkDress2Transfer(Abc_Ntk_t *pNtk0,Abc_Ntk_t *pNtk1,Vec_Ptr_t *vRes,int fVerbose)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p;
  char *pcVar3;
  char *pName;
  uint local_58;
  int Counter;
  int CounterInv;
  int Entry;
  int fComp1;
  int fComp0;
  int k;
  int i;
  Abc_Obj_t *pObj1;
  Abc_Obj_t *pObj0;
  Vec_Int_t *vClass;
  int fVerbose_local;
  Vec_Ptr_t *vRes_local;
  Abc_Ntk_t *pNtk1_local;
  Abc_Ntk_t *pNtk0_local;
  
  local_58 = 0;
  pName._4_4_ = 0;
  for (fComp0 = 0; iVar1 = Vec_PtrSize(vRes), fComp0 < iVar1; fComp0 = fComp0 + 1) {
    p = (Vec_Int_t *)Vec_PtrEntry(vRes,fComp0);
    _k = (Abc_Obj_t *)0x0;
    pObj1 = (Abc_Obj_t *)0x0;
    CounterInv = 0;
    Entry = 0;
    for (fComp1 = 0; iVar1 = Vec_IntSize(p), fComp1 < iVar1; fComp1 = fComp1 + 1) {
      iVar1 = Vec_IntEntry(p,fComp1);
      iVar2 = Abc_ObjEquivId2NtkId(iVar1);
      if (iVar2 == 0) {
        iVar2 = Abc_ObjEquivId2ObjId(iVar1);
        pObj1 = Abc_NtkObj(pNtk0,iVar2);
        Entry = Abc_ObjEquivId2Polar(iVar1);
      }
      else {
        iVar2 = Abc_ObjEquivId2ObjId(iVar1);
        _k = Abc_NtkObj(pNtk1,iVar2);
        CounterInv = Abc_ObjEquivId2Polar(iVar1);
      }
    }
    if ((((pObj1 != (Abc_Obj_t *)0x0) && (_k != (Abc_Obj_t *)0x0)) &&
        (pcVar3 = Nm_ManFindNameById(pNtk0->pManName,pObj1->Id), pcVar3 == (char *)0x0)) &&
       (pcVar3 = Nm_ManFindNameById(pNtk1->pManName,_k->Id), pcVar3 != (char *)0x0)) {
      if (Entry == CounterInv) {
        Abc_ObjAssignName(pObj1,pcVar3,(char *)0x0);
        pName._4_4_ = pName._4_4_ + 1;
      }
      else {
        Abc_ObjAssignName(pObj1,pcVar3,"_inv");
        local_58 = local_58 + 1;
      }
    }
  }
  if (fVerbose != 0) {
    printf("Total number of names assigned  = %5d. (Dir = %5d. Compl = %5d.)\n",
           (ulong)(pName._4_4_ + local_58),(ulong)pName._4_4_,(ulong)local_58);
  }
  return;
}

Assistant:

void Abc_NtkDress2Transfer( Abc_Ntk_t * pNtk0, Abc_Ntk_t * pNtk1, Vec_Ptr_t * vRes, int fVerbose )
{
    Vec_Int_t * vClass;
    Abc_Obj_t * pObj0, * pObj1;
    int i, k, fComp0, fComp1, Entry;
    int CounterInv = 0, Counter = 0;
    char * pName;
    Vec_PtrForEachEntry( Vec_Int_t *, vRes, vClass, i )
    {
        pObj0 = pObj1 = NULL;
        fComp0 = fComp1 = 0;
        Vec_IntForEachEntry( vClass, Entry, k )
        {
            if ( Abc_ObjEquivId2NtkId(Entry) )
            {
                pObj1 = Abc_NtkObj( pNtk1, Abc_ObjEquivId2ObjId(Entry) );
                fComp1 = Abc_ObjEquivId2Polar(Entry);
            }
            else
            {
                pObj0 = Abc_NtkObj( pNtk0, Abc_ObjEquivId2ObjId(Entry) );
                fComp0 = Abc_ObjEquivId2Polar(Entry);
            }
        }
        if ( pObj0 == NULL || pObj1 == NULL )
            continue;
        // if the node already has a name, quit
        pName = Nm_ManFindNameById( pNtk0->pManName, pObj0->Id );
        if ( pName != NULL )
            continue;
        // if the other node has no name, quit
        pName = Nm_ManFindNameById( pNtk1->pManName, pObj1->Id );
        if ( pName == NULL )
            continue;
        // assign name
        if ( fComp0 ^ fComp1 )
        {
            Abc_ObjAssignName( pObj0, pName, "_inv" );
            CounterInv++;
        }
        else
        {
            Abc_ObjAssignName( pObj0, pName, NULL );
            Counter++;
        }
    }
    if ( fVerbose )
    {
        printf( "Total number of names assigned  = %5d. (Dir = %5d. Compl = %5d.)\n", 
            Counter + CounterInv, Counter, CounterInv );
    }
}